

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::EltwiseParameter::Clear(EltwiseParameter *this)

{
  EltwiseParameter *this_local;
  
  google::protobuf::RepeatedField<float>::Clear(&this->coeff_);
  if (((this->_has_bits_).has_bits_[0] & 3) != 0) {
    this->operation_ = 1;
    this->stable_prod_grad_ = true;
  }
  memset(&this->_has_bits_,0,4);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void EltwiseParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.EltwiseParameter)
  coeff_.Clear();
  if (_has_bits_[0 / 32] & 3u) {
    operation_ = 1;
    stable_prod_grad_ = true;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}